

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::Object::modifyGL
          (Object *this,SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync,
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
          *deps)

{
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  *this_00;
  deInt32 *pdVar1;
  FenceSync *pFVar2;
  SharedPtrStateBase *pSVar3;
  SharedPtrStateBase *pSVar4;
  long lVar5;
  pointer pSVar6;
  long lVar7;
  
  this_00 = &this->m_readSyncs;
  pSVar6 = (this->m_readSyncs).
           super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_readSyncs).
                              super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 4)) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      pFVar2 = *(FenceSync **)((long)&pSVar6->m_ptr + lVar7);
      if (pFVar2 != (FenceSync *)0x0) {
        FenceSync::addWaiter(pFVar2);
        pSVar6 = (this_00->
                 super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      std::
      vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
      ::push_back(deps,(value_type *)((long)&pSVar6->m_ptr + lVar7));
      lVar5 = lVar5 + 1;
      pSVar6 = (this->m_readSyncs).
               super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (lVar5 < (int)((ulong)((long)(this->m_readSyncs).
                                         super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6)
                          >> 4));
  }
  pFVar2 = (this->m_modifySync).m_ptr;
  if (pFVar2 != (FenceSync *)0x0) {
    FenceSync::addWaiter(pFVar2);
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::push_back(deps,&this->m_modifySync);
  pSVar3 = (this->m_modifySync).m_state;
  pSVar4 = sync->m_state;
  if (pSVar3 != pSVar4) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar3->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_modifySync).m_ptr = (FenceSync *)0x0;
        (*((this->m_modifySync).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_modifySync).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar3 = (this->m_modifySync).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_modifySync).m_state = (SharedPtrStateBase *)0x0;
      }
      pSVar4 = sync->m_state;
    }
    (this->m_modifySync).m_ptr = sync->m_ptr;
    (this->m_modifySync).m_state = pSVar4;
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_modifySync).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::_M_erase_at_end(this_00,(this_00->
                            super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Object::modifyGL (SharedPtr<FenceSync> sync, std::vector<SharedPtr<FenceSync> >& deps)
{
	// Make call depend on all reads
	for (int readNdx = 0; readNdx < (int)m_readSyncs.size(); readNdx++)
	{
		if (m_readSyncs[readNdx])
			m_readSyncs[readNdx]->addWaiter();

		deps.push_back(m_readSyncs[readNdx]);
	}

	if (m_modifySync)
		m_modifySync->addWaiter();

	deps.push_back(m_modifySync);

	// Update last modifying call
	m_modifySync = sync;

	// Clear read dependencies of last "version" of this object
	m_readSyncs.clear();
}